

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyTextureState
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,TextureImplType *Texture,
          RESOURCE_STATE RequiredState,char *OperationName)

{
  bool bVar1;
  RESOURCE_STATE State;
  RESOURCE_STATE State_00;
  char (*Args_7) [135];
  char *OperationName_local;
  String local_78;
  string _msg;
  String local_38;
  
  if ((Texture->super_TextureBase<Diligent::EngineVkImplTraits>).m_State != RESOURCE_STATE_UNKNOWN)
  {
    OperationName_local = OperationName;
    bVar1 = TextureBase<Diligent::EngineVkImplTraits>::CheckState
                      (&Texture->super_TextureBase<Diligent::EngineVkImplTraits>,RequiredState);
    if (!bVar1) {
      GetResourceStateString_abi_cxx11_(&local_78,(Diligent *)(ulong)RequiredState,State);
      Args_7 = (char (*) [135])0x2a9e16;
      GetResourceStateString_abi_cxx11_
                (&local_38,
                 (Diligent *)
                 (ulong)(Texture->super_TextureBase<Diligent::EngineVkImplTraits>).m_State,State_00)
      ;
      FormatString<char_const*,char[20],char_const*,char[25],std::__cxx11::string,char[31],std::__cxx11::string,char[135]>
                (&_msg,(Diligent *)&OperationName_local,(char **)" requires texture \'",
                 (char (*) [20])
                 &(Texture->super_TextureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                  .m_Desc,(char **)"\' to be transitioned to ",(char (*) [25])&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 " state. Actual texture state: ",(char (*) [31])&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ". Use appropriate state transition flags or explicitly transition the texture using IDeviceContext::TransitionResourceStates() method."
                 ,Args_7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_msg._M_dataplus._M_p != &_msg.field_2) {
        operator_delete(_msg._M_dataplus._M_p,_msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::DvpVerifyTextureState(
    const TextureImplType& Texture,
    RESOURCE_STATE         RequiredState,
    const char*            OperationName) const
{
    if (Texture.IsInKnownState() && !Texture.CheckState(RequiredState))
    {
        LOG_ERROR_MESSAGE(OperationName, " requires texture '", Texture.GetDesc().Name, "' to be transitioned to ", GetResourceStateString(RequiredState),
                          " state. Actual texture state: ", GetResourceStateString(Texture.GetState()),
                          ". Use appropriate state transition flags or explicitly transition the texture using IDeviceContext::TransitionResourceStates() method.");
    }
}